

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4_stream.cpp
# Opt level: O0

void __thiscall minibag::LZ4Stream::writeStream(LZ4Stream *this,int action)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *__a;
  undefined8 uVar2;
  FILE *__s;
  size_t sVar3;
  BagException *this_01;
  int in_ESI;
  Stream *in_RDI;
  int to_write;
  int ret;
  string *in_stack_fffffffffffffe98;
  BagIOException *in_stack_fffffffffffffea0;
  _func_int **in_stack_fffffffffffffeb0;
  roslz4_stream *in_stack_fffffffffffffeb8;
  allocator<char> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  char *__s_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  bool local_f2;
  char local_91 [39];
  undefined1 local_6a;
  undefined1 local_45;
  int local_10;
  int local_c;
  
  local_10 = 0;
  local_c = in_ESI;
  while( true ) {
    local_f2 = true;
    if (*(int *)&in_RDI[2].file_ < 1) {
      local_f2 = local_c == 1 && local_10 != 2;
    }
    if (!local_f2) break;
    local_10 = roslz4_compress(in_stack_fffffffffffffeb8,
                               (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
    switch(local_10) {
    case 0:
      break;
    case 2:
      break;
    case -4:
      local_6a = 1;
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      BagIOException::BagIOException(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      local_6a = 0;
      __cxa_throw(this_00,&BagIOException::typeinfo,BagIOException::~BagIOException);
    default:
      uVar2 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      BagException::BagException
                (&in_stack_fffffffffffffea0->super_BagException,in_stack_fffffffffffffe98);
      __cxa_throw(uVar2,&BagException::typeinfo,BagException::~BagException);
    case -2:
      if ((long)in_RDI[3]._vptr_Stream - (long)in_RDI[1]._vptr_Stream ==
          (long)*(int *)&in_RDI[1].file_) {
        local_45 = 1;
        uVar2 = __cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        BagIOException::BagIOException(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        local_45 = 0;
        __cxa_throw(uVar2,&BagIOException::typeinfo,BagIOException::~BagIOException);
      }
      break;
    case -1:
      __a = (allocator<char> *)__cxa_allocate_exception(0x10);
      __s_00 = local_91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffee0,__s_00,__a);
      BagIOException::BagIOException(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      __cxa_throw(__a,&BagIOException::typeinfo,BagIOException::~BagIOException);
    }
    iVar1 = (int)in_RDI[3]._vptr_Stream - (int)in_RDI[1]._vptr_Stream;
    if (0 < iVar1) {
      in_stack_fffffffffffffeb0 = in_RDI[1]._vptr_Stream;
      in_stack_fffffffffffffeb8 = (roslz4_stream *)(long)iVar1;
      __s = (FILE *)Stream::getFilePointer(in_RDI);
      sVar3 = fwrite(in_stack_fffffffffffffeb0,1,(size_t)in_stack_fffffffffffffeb8,__s);
      if (sVar3 != (long)iVar1) {
        this_01 = (BagException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        BagException::BagException(this_01,in_stack_fffffffffffffe98);
        __cxa_throw(this_01,&BagException::typeinfo,BagException::~BagException);
      }
      Stream::advanceOffset(in_RDI,(long)iVar1);
      in_RDI[3]._vptr_Stream = in_RDI[1]._vptr_Stream;
      *(undefined4 *)&in_RDI[3].file_ = *(undefined4 *)&in_RDI[1].file_;
    }
  }
  return;
}

Assistant:

void LZ4Stream::writeStream(int action) {
    int ret = ROSLZ4_OK;
    while (lz4s_.input_left > 0 ||
           (action == ROSLZ4_FINISH && ret != ROSLZ4_STREAM_END)) {
        ret = roslz4_compress(&lz4s_, action);
        switch(ret) {
        case ROSLZ4_OK: break;
        case ROSLZ4_OUTPUT_SMALL:
            if (lz4s_.output_next - buff_ == buff_size_) {
                throw BagIOException("ROSLZ4_OUTPUT_SMALL: output buffer is too small");
            } else {
                // There's data to be written in buff_; this will free up space
                break;
            }
        case ROSLZ4_STREAM_END: break;
        case ROSLZ4_PARAM_ERROR: throw BagIOException("ROSLZ4_PARAM_ERROR: bad block size"); break;
        case ROSLZ4_ERROR: throw BagIOException("ROSLZ4_ERROR: compression error"); break;
        default: throw BagException("Unhandled return code");
        }

        // If output data is ready, write to disk
        int to_write = lz4s_.output_next - buff_;
        if (to_write > 0) {
            if (fwrite(buff_, 1, to_write, getFilePointer()) != static_cast<size_t>(to_write)) {
                throw BagException("Problem writing data to disk");
            }
            advanceOffset(to_write);
            lz4s_.output_next = buff_;
            lz4s_.output_left = buff_size_;
        }
    }
}